

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::LoadToWallet(CWallet *this,uint256 *hash,UpdateWalletTxFn *fill_wtx)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  CWallet *pCVar4;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar5;
  TxStateBlockConflicted *prev;
  CWalletTx *prevtx;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CWalletTx *wtx;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  *ins;
  iterator it;
  const_iterator __end1;
  const_iterator __begin1;
  CWallet *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  CWallet *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  CWalletTx *in_stack_fffffffffffffed8;
  CWallet *in_stack_fffffffffffffee0;
  CWallet *in_stack_fffffffffffffee8;
  CWallet *pCVar6;
  bool local_99;
  _Base_ptr local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::forward_as_tuple<uint256_const&>
            ((uint256 *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  TxStateInactive::TxStateInactive((TxStateInactive *)in_stack_fffffffffffffeb8,false);
  std::forward_as_tuple<decltype(nullptr),wallet::TxStateInactive>
            ((void **)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (TxStateInactive *)in_stack_fffffffffffffeb8);
  pVar5 = std::
          unordered_map<uint256,wallet::CWalletTx,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<uint256_const&>,std::tuple<decltype(nullptr)&&,wallet::TxStateInactive&&>>
                    ((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                      *)in_stack_fffffffffffffed8,
                     (piecewise_construct_t *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (tuple<const_uint256_&> *)in_stack_fffffffffffffec8,
                     (tuple<std::nullptr_t_&&,_wallet::TxStateInactive_&&> *)
                     CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  ppVar3 = _GLOBAL__N_1::std::__detail::
           _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                     ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                      in_stack_fffffffffffffeb8);
  pCVar6 = (CWallet *)&ppVar3->second;
  bVar2 = std::function<bool_(wallet::CWalletTx_&,_bool)>::operator()
                    ((function<bool_(wallet::CWalletTx_&,_bool)> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (CWalletTx *)in_stack_fffffffffffffec8,
                     SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
  if (bVar2) {
    bVar2 = HaveChain(in_stack_fffffffffffffeb8);
    if (bVar2) {
      pCVar4 = pCVar6;
      chain(in_stack_fffffffffffffec8);
      CWalletTx::updateState
                ((CWalletTx *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (Chain *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffee8 = pCVar6;
      pCVar6 = pCVar4;
    }
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_stack_fffffffffffffee0 = (CWallet *)&in_RDI->wtxOrdered;
      std::make_pair<long&,wallet::CWalletTx*>
                ((long *)in_stack_fffffffffffffec8,
                 (CWalletTx **)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      std::
      multimap<long,wallet::CWalletTx*,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
      ::insert<std::pair<long,wallet::CWalletTx*>>
                ((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                  *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (pair<long,_wallet::CWalletTx_*> *)in_stack_fffffffffffffeb8);
      std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>::
      _Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> *)
                 in_stack_fffffffffffffeb8,(iterator *)0xadb3ba);
      ((const_iterator *)&pCVar6->m_birth_time)->_M_node = local_58;
    }
    AddToSpends(in_stack_fffffffffffffee8,(CWalletTx *)in_stack_fffffffffffffee0,
                (WalletBatch *)in_stack_fffffffffffffed8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffeb8);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffec8,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed8 = (CWalletTx *)&in_RDI->mapWallet;
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_fffffffffffffeb8);
      _GLOBAL__N_1::std::
      unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
      ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (key_type *)in_stack_fffffffffffffeb8);
      _GLOBAL__N_1::std::
      unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
      ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
             *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      bVar2 = _GLOBAL__N_1::std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         in_stack_fffffffffffffec8,
                         (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        _GLOBAL__N_1::std::__detail::
        _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                  ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                   in_stack_fffffffffffffeb8);
        pCVar4 = (CWallet *)
                 CWalletTx::state<wallet::TxStateBlockConflicted>
                           ((CWalletTx *)in_stack_fffffffffffffeb8);
        if (pCVar4 != (CWallet *)0x0) {
          CWalletTx::GetHash((CWalletTx *)in_stack_fffffffffffffeb8);
          transaction_identifier::operator_cast_to_uint256_
                    ((transaction_identifier<false> *)in_stack_fffffffffffffeb8);
          MarkConflicted(in_RDI,(uint256 *)in_stack_fffffffffffffee8,(int)((ulong)pCVar6 >> 0x20),
                         (uint256 *)in_stack_fffffffffffffee0);
          in_stack_fffffffffffffec8 = pCVar4;
        }
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffffeb8);
    }
    CWalletTx::GetTxTime(in_stack_fffffffffffffed8);
    MaybeUpdateBirthTime(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
    local_99 = true;
  }
  else {
    local_99 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool CWallet::LoadToWallet(const uint256& hash, const UpdateWalletTxFn& fill_wtx)
{
    const auto& ins = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(nullptr, TxStateInactive{}));
    CWalletTx& wtx = ins.first->second;
    if (!fill_wtx(wtx, ins.second)) {
        return false;
    }
    // If wallet doesn't have a chain (e.g when using bitcoin-wallet tool),
    // don't bother to update txn.
    if (HaveChain()) {
      wtx.updateState(chain());
    }
    if (/* insertion took place */ ins.second) {
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
    }
    AddToSpends(wtx);
    for (const CTxIn& txin : wtx.tx->vin) {
        auto it = mapWallet.find(txin.prevout.hash);
        if (it != mapWallet.end()) {
            CWalletTx& prevtx = it->second;
            if (auto* prev = prevtx.state<TxStateBlockConflicted>()) {
                MarkConflicted(prev->conflicting_block_hash, prev->conflicting_block_height, wtx.GetHash());
            }
        }
    }

    // Update birth time when tx time is older than it.
    MaybeUpdateBirthTime(wtx.GetTxTime());

    return true;
}